

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

shared_ptr<mocker::ast::VarDeclStmt> __thiscall
mocker::Parser::varDeclStmt(Parser *this,TokIter *iter,TokIter end)

{
  Position beg;
  Position beg_00;
  Position beg_01;
  Position end_00;
  Position end_01;
  Position end_02;
  undefined4 uVar1;
  TokIter TVar2;
  TokIter TVar3;
  TokenID TVar4;
  TokenID TVar5;
  CompileError *pCVar6;
  Token *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  Token *pTVar8;
  bool bVar9;
  shared_ptr<mocker::ast::Type> sVar10;
  shared_ptr<mocker::ast::Identifier> sVar11;
  shared_ptr<mocker::ast::VarDeclStmt> sVar12;
  Position beg_02;
  Position beg_03;
  Position end_03;
  Position end_04;
  Parser local_88;
  shared_ptr<mocker::ast::Type> *local_70;
  shared_ptr<mocker::ast::Type> varType;
  shared_ptr<mocker::ast::Expression> expr;
  shared_ptr<mocker::ast::Identifier> ident;
  
  Token::position(*end._M_current);
  TVar3._M_current = local_88.tokEnd._M_current;
  TVar2._M_current = local_88.tokBeg._M_current;
  TVar5 = (end._M_current)->id;
  uVar1 = *(undefined4 *)&(end._M_current)->field_0x4;
  sVar10 = type(&local_88,iter,end);
  _Var7 = sVar10.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (local_88.tokBeg._M_current == (Token *)0x0) {
    bVar9 = true;
  }
  else {
    sVar11 = identifier((Parser *)&varType,iter,end);
    _Var7 = sVar11.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if (varType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      bVar9 = true;
    }
    else {
      pTVar8 = *end._M_current;
      *(Token **)end._M_current = pTVar8 + 1;
      if (pTVar8 == in_RCX) {
        TVar4 = Error;
      }
      else {
        TVar4 = Token::tokenID(pTVar8);
        _Var7._M_pi = extraout_RDX;
      }
      bVar9 = TVar4 == LeftParen;
    }
    if (varType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (varType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var7._M_pi = extraout_RDX_00;
    }
  }
  if (local_88.tokEnd._M_current != (Token *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.tokEnd._M_current);
    _Var7._M_pi = extraout_RDX_01;
  }
  (end._M_current)->id = TVar5;
  *(undefined4 *)&(end._M_current)->field_0x4 = uVar1;
  if (bVar9) {
    (this->tokBeg)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)0x0;
    goto LAB_0017d52c;
  }
  type((Parser *)&varType,iter,end);
  if (varType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("varType",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                  ,0x1bd,
                  "std::shared_ptr<ast::VarDeclStmt> mocker::Parser::varDeclStmt(TokIter &, TokIter)"
                 );
  }
  identifier((Parser *)&ident,iter,end);
  if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("ident",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                  ,0x1bf,
                  "std::shared_ptr<ast::VarDeclStmt> mocker::Parser::varDeclStmt(TokIter &, TokIter)"
                 );
  }
  pTVar8 = *end._M_current;
  if (pTVar8 != in_RCX) {
    TVar5 = Token::tokenID(pTVar8);
    pTVar8 = *end._M_current;
    if (TVar5 != Semicolon) goto LAB_0017d435;
    *(Token **)end._M_current = pTVar8 + 1;
    Token::position(pTVar8);
    expr.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    beg_02.col = (size_t)TVar2._M_current;
    beg_02.line = (size_t)iter;
    end_03.col = (size_t)local_88.pos;
    end_03.line = (size_t)TVar3._M_current;
    sVar12 = makeNode<mocker::ast::VarDeclStmt,std::shared_ptr<mocker::ast::Type>&,std::shared_ptr<mocker::ast::Identifier>&,decltype(nullptr)>
                       (this,beg_02,end_03,local_70,(shared_ptr<mocker::ast::Identifier> *)&varType,
                        (void **)&ident);
    _Var7 = sVar12.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
LAB_0017d50e:
    if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var7._M_pi = extraout_RDX_03;
    }
    if (varType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (varType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var7._M_pi = extraout_RDX_04;
    }
LAB_0017d52c:
    sVar12.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var7._M_pi;
    sVar12.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<mocker::ast::VarDeclStmt>)
           sVar12.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>;
  }
LAB_0017d435:
  if (pTVar8 == in_RCX) {
LAB_0017d53e:
    pCVar6 = (CompileError *)__cxa_allocate_exception(0x48);
    Token::position(*end._M_current);
    end_00.col = (size_t)local_70;
    end_00.line = (size_t)local_88.pos;
    beg.col = (size_t)TVar3._M_current;
    beg.line = (size_t)TVar2._M_current;
    CompileError::CompileError(pCVar6,beg,end_00);
    *(undefined ***)pCVar6 = &PTR__CompileError_001eba98;
    __cxa_throw(pCVar6,&SyntaxError::typeinfo,CompileError::~CompileError);
  }
  TVar5 = Token::tokenID(pTVar8);
  if (TVar5 != Assign) goto LAB_0017d53e;
  *(long *)end._M_current = *(long *)end._M_current + 0x38;
  local_88.tokBeg._M_current = (Token *)logicalOrExpr;
  local_88.tokEnd._M_current = (Token *)0x0;
  local_88.pos = (unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                  *)iter;
  auxBinaryExpr<std::_Bind<std::shared_ptr<mocker::ast::Expression>(mocker::Parser::*(mocker::Parser*,std::_Placeholder<1>,std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>&,__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>)>>
            ((Parser *)&expr,iter,end,
             (_Bind<std::shared_ptr<mocker::ast::Expression>_(mocker::Parser::*(mocker::Parser_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>_&,___gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>)>
              *)in_RCX,(pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> *)&local_88);
  if (expr.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pCVar6 = (CompileError *)__cxa_allocate_exception(0x48);
    Token::position(*end._M_current);
    end_02.col = (size_t)local_70;
    end_02.line = (size_t)local_88.pos;
    beg_01.col = (size_t)TVar3._M_current;
    beg_01.line = (size_t)TVar2._M_current;
    CompileError::CompileError(pCVar6,beg_01,end_02);
    goto LAB_0017d640;
  }
  if (*end._M_current != in_RCX) {
    TVar5 = Token::tokenID(*end._M_current);
    if (TVar5 == Semicolon) {
      pTVar8 = *end._M_current;
      *(Token **)end._M_current = pTVar8 + 1;
      Token::position(pTVar8);
      beg_03.col = (size_t)TVar2._M_current;
      beg_03.line = (size_t)iter;
      end_04.col = (size_t)local_88.pos;
      end_04.line = (size_t)TVar3._M_current;
      sVar12 = makeNode<mocker::ast::VarDeclStmt,std::shared_ptr<mocker::ast::Type>&,std::shared_ptr<mocker::ast::Identifier>&,std::shared_ptr<mocker::ast::Expression>&>
                         (this,beg_03,end_04,local_70,
                          (shared_ptr<mocker::ast::Identifier> *)&varType,
                          (shared_ptr<mocker::ast::Expression> *)&ident);
      _Var7 = sVar12.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (expr.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (expr.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var7._M_pi = extraout_RDX_02;
      }
      goto LAB_0017d50e;
    }
  }
  pCVar6 = (CompileError *)__cxa_allocate_exception(0x48);
  Token::position(*end._M_current);
  end_01.col = (size_t)local_70;
  end_01.line = (size_t)local_88.pos;
  beg_00.col = (size_t)TVar3._M_current;
  beg_00.line = (size_t)TVar2._M_current;
  CompileError::CompileError(pCVar6,beg_00,end_01);
LAB_0017d640:
  *(undefined ***)pCVar6 = &PTR__CompileError_001eba98;
  __cxa_throw(pCVar6,&SyntaxError::typeinfo,CompileError::~CompileError);
}

Assistant:

std::shared_ptr<ast::VarDeclStmt> Parser::varDeclStmt(TokIter &iter,
                                                      TokIter end) {
  auto id = GetTokenID(end);
  auto begPos = iter->position().first;
  auto throwError = [begPos, &iter] {
    throw SyntaxError(begPos, iter->position().second);
  };

  // look ahead
  auto beg = iter;
  if (!type(iter, end) || !identifier(iter, end) ||
      id(iter++) == TokenID::LeftParen) {
    iter = beg;
    return nullptr;
  }
  iter = beg;

  auto varType = type(iter, end);
  assert(varType);
  auto ident = identifier(iter, end);
  assert(ident);
  if (id(iter) == TokenID::Semicolon)
    return makeNode<ast::VarDeclStmt>(begPos, (iter++)->position().second,
                                      varType, ident, nullptr);

  if (id(iter) != TokenID::Assign)
    throwError();
  ++iter;
  auto expr = expression(iter, end);
  if (!expr)
    throwError();
  if (id(iter) != TokenID::Semicolon)
    throwError();
  return makeNode<ast::VarDeclStmt>(begPos, (iter++)->position().second,
                                    varType, ident, expr);
}